

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O1

void __thiscall JSON::JSON_string::~JSON_string(JSON_string *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_JSON_value)._vptr_JSON_value = (_func_int **)&PTR__JSON_string_00342930;
  pcVar1 = (this->utf8)._M_dataplus._M_p;
  paVar2 = &(this->utf8).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~JSON_string() override = default;